

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lesson.h
# Opt level: O3

double __thiscall Lesson::score(Lesson *this,double avg_score)

{
  pointer pPVar1;
  pointer pPVar2;
  undefined1 auVar3 [16];
  long lVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  double *pdVar8;
  float fVar9;
  double dVar10;
  double dVar11;
  initializer_list<double> __l;
  vector<double,_std::allocator<double>_> a;
  allocator_type local_71;
  double local_70;
  double local_68;
  vector<double,_std::allocator<double>_> local_60;
  double local_48 [7];
  
  local_48[4] = 0.2;
  local_48[5] = 0.1;
  local_48[2] = 0.3;
  local_48[3] = 0.2;
  local_48[0] = 0.1;
  local_48[1] = 0.4;
  local_48[6] = 0.1;
  __l._M_len = 7;
  __l._M_array = local_48;
  local_70 = avg_score;
  std::vector<double,_std::allocator<double>_>::vector(&local_60,__l,&local_71);
  pPVar1 = (this->prep_list).super__Vector_base<Professor,_std::allocator<Professor>_>._M_impl.
           super__Vector_impl_data._M_start;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = this->lesson_id;
  iVar5 = (int)this->lesson_id;
  iVar7 = SUB164(auVar3 * ZEXT816(0x2492492492492493),8);
  dVar10 = *(double *)
            ((long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start +
            (ulong)(((((uint)(iVar5 - iVar7) >> 1) + iVar7 >> 2) * -7 + iVar5) * 8));
  pPVar2 = (this->prep_list).super__Vector_base<Professor,_std::allocator<Professor>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pPVar1 == pPVar2) {
    dVar11 = local_70 / 5.0 + 0.0;
  }
  else {
    lVar4 = ((long)pPVar2 - (long)pPVar1 >> 4) * 0x2e8ba2e8ba2e8ba3;
    lVar6 = lVar4 + (ulong)(lVar4 == 0);
    pdVar8 = &pPVar1->total;
    dVar11 = 0.0;
    do {
      dVar11 = dVar11 + *pdVar8 / 5.0;
      pdVar8 = pdVar8 + 0x16;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
    dVar11 = dVar11 / (double)lVar4;
    if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start == (pointer)0x0) goto LAB_0010d164;
  }
  local_70 = dVar10;
  local_68 = dVar11;
  operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                  (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
  dVar10 = local_70;
  dVar11 = local_68;
LAB_0010d164:
  fVar9 = roundf((float)((dVar10 + dVar11) * 1000.0));
  return (double)(fVar9 / 1000.0);
}

Assistant:

double Lesson::score(double avg_score)
{
    double professor_score = 0;
    std::vector <double> a = {0.1, 0.4, 0.3, 0.2, 0.2, 0.1, 0.1};
    double location_score = a[lesson_id%7];
    if (!prep_list.empty()) {
        for(int i = 0; i < prep_list.size(); i++){
            professor_score+= double(prep_list[i].total)/5;
        }
        professor_score = professor_score/prep_list.size();
    }
    else {
        professor_score+= double(avg_score)/5;
    }

    return roundf((professor_score + location_score) * 1000 )/ 1000;
}